

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O1

vector<long,_std::allocator<long>_> * __thiscall
tinyusdz::Prim::get_child_indices_from_primChildren
          (Prim *this,bool force_update,bool *indices_is_valid)

{
  vector<long,_std::allocator<long>_> *this_00;
  pointer pTVar1;
  long lVar2;
  long *plVar3;
  PrimMeta *pPVar4;
  pointer pPVar5;
  iterator iVar6;
  ulong uVar7;
  long *plVar8;
  bool bVar9;
  bool bVar10;
  long lVar11;
  undefined7 in_register_00000031;
  ulong uVar12;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> table;
  string tok;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  m;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_b0;
  key_type local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  local_60;
  
  if ((int)CONCAT71(in_register_00000031,force_update) == 0) {
    if (((long)(this->_primChildrenIndices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(this->_primChildrenIndices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_start >> 3 ==
         ((long)(this->_children).
                super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->_children).
                super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                super__Vector_impl_data._M_start >> 4) * 0x21cfb2b78c13521d) &&
       (this->_child_dirty == false)) {
      if (indices_is_valid != (bool *)0x0) {
        *indices_is_valid = this->_primChildrenIndicesIsValid;
      }
      goto LAB_0029170a;
    }
    if (!force_update) {
      this->_child_dirty = false;
    }
  }
  pPVar4 = metas(this);
  if ((pPVar4->primChildren).super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (pPVar4->primChildren).super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    ::std::vector<long,_std::allocator<long>_>::resize
              ((vector<long,_std::allocator<long>_> *)&this->_primChildrenIndices,
               ((long)(this->_children).
                      super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->_children).
                      super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                      super__Vector_impl_data._M_start >> 4) * 0x21cfb2b78c13521d);
    plVar8 = (this->_primChildrenIndices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start;
    plVar3 = (this->_primChildrenIndices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (plVar8 != plVar3) {
      lVar11 = 0;
      do {
        *plVar8 = lVar11;
        lVar11 = lVar11 + 1;
        plVar8 = plVar8 + 1;
      } while (plVar8 != plVar3);
    }
    this->_primChildrenIndicesIsValid = true;
    if (indices_is_valid != (bool *)0x0) {
      *indices_is_valid = true;
    }
  }
  else {
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_b0._M_impl._0_8_ = 0;
    pPVar5 = (this->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((this->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
        _M_impl.super__Vector_impl_data._M_finish != pPVar5) {
      do {
        ::std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
        ::_M_emplace_unique<std::__cxx11::string_const&,unsigned_long&>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                    *)&local_60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &pPVar5[local_b0._M_impl._0_8_]._elementPath,(unsigned_long *)&local_b0);
        local_b0._M_impl._0_8_ = local_b0._M_impl._0_8_ + 1;
        pPVar5 = (this->_children).
                 super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                 super__Vector_impl_data._M_start;
      } while ((ulong)local_b0._M_impl._0_8_ <
               (ulong)(((long)(this->_children).
                              super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)pPVar5 >> 4) *
                      0x21cfb2b78c13521d));
    }
    local_b0._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_b0._M_impl.super__Rb_tree_header._M_header;
    local_b0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_b0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_b0._M_impl.super__Rb_tree_header._M_node_count = 0;
    this_00 = &this->_primChildrenIndices;
    local_b0._M_impl.super__Rb_tree_header._M_header._M_right =
         local_b0._M_impl.super__Rb_tree_header._M_header._M_left;
    pPVar4 = metas(this);
    ::std::vector<long,_std::allocator<long>_>::resize
              ((vector<long,_std::allocator<long>_> *)this_00,
               (long)(pPVar4->primChildren).
                     super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(pPVar4->primChildren).
                     super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                     super__Vector_impl_data._M_start >> 5);
    if ((this->_primChildrenIndices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        (this->_primChildrenIndices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar7 = 0;
      bVar9 = true;
    }
    else {
      bVar9 = true;
      lVar11 = 8;
      uVar12 = 0;
      do {
        pPVar4 = metas(this);
        pTVar1 = (pPVar4->primChildren).
                 super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar2 = *(long *)((long)pTVar1 + lVar11 + -8);
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_80,lVar2,
                   *(long *)((long)&(pTVar1->str_)._M_dataplus._M_p + lVar11) + lVar2);
        iVar6 = ::std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                ::find(&local_60,&local_80);
        if ((_Rb_tree_header *)iVar6._M_node == &local_60._M_impl.super__Rb_tree_header) {
          (this_00->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data
          ._M_start[uVar12] = -1;
          bVar9 = false;
        }
        else {
          (this_00->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data
          ._M_start[uVar12] = *(long *)(iVar6._M_node + 2);
          ::std::
          _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
          ::_M_insert_unique<unsigned_long_const&>
                    ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                      *)&local_b0,(unsigned_long *)(iVar6._M_node + 2));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        uVar12 = uVar12 + 1;
        uVar7 = (long)(this->_primChildrenIndices).super__Vector_base<long,_std::allocator<long>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(this->_primChildrenIndices).super__Vector_base<long,_std::allocator<long>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3;
        lVar11 = lVar11 + 0x20;
      } while (uVar12 < uVar7);
    }
    bVar10 = false;
    if (local_b0._M_impl.super__Rb_tree_header._M_node_count == uVar7) {
      bVar10 = bVar9;
    }
    this->_primChildrenIndicesIsValid = bVar10;
    if (indices_is_valid != (bool *)0x0) {
      *indices_is_valid = bVar10;
    }
    ::std::
    _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
    ::_M_erase(&local_b0,(_Link_type)local_b0._M_impl.super__Rb_tree_header._M_header._M_parent);
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
    ::_M_erase(&local_60,(_Link_type)local_60._M_impl.super__Rb_tree_header._M_header._M_parent);
  }
LAB_0029170a:
  return &this->_primChildrenIndices;
}

Assistant:

const std::vector<int64_t> &Prim::get_child_indices_from_primChildren(
    bool force_update, bool *indices_is_valid) const {
#if defined(TINYUSDZ_ENABLE_THREAD)
  // TODO: Only take a lock when dirty.
  std::lock_guard<std::mutex> lock(_mutex);
#endif

  if (!force_update && (_primChildrenIndices.size() == _children.size()) &&
      !_child_dirty) {
    // got cache.
    if (indices_is_valid) {
      (*indices_is_valid) = _primChildrenIndicesIsValid;
    }
    return _primChildrenIndices;
  }

  if (!force_update) {
    _child_dirty = false;
  }

  if (metas().primChildren.empty()) {
    _primChildrenIndices.resize(_children.size());
    std::iota(_primChildrenIndices.begin(), _primChildrenIndices.end(), 0);
    _primChildrenIndicesIsValid = true;
    if (indices_is_valid) {
      (*indices_is_valid) = _primChildrenIndicesIsValid;
    }
    return _primChildrenIndices;
  }

  std::map<std::string, size_t> m;  // name -> children() index map
  for (size_t i = 0; i < _children.size(); i++) {
    m.emplace(_children[i].element_name(), i);
  }
  std::set<size_t> table;  // to check uniqueness

  // Use the length of primChildren.
  _primChildrenIndices.resize(metas().primChildren.size());

  bool valid = true;

  for (size_t i = 0; i < _primChildrenIndices.size(); i++) {
    std::string tok = metas().primChildren[i].str();
    const auto it = m.find(tok);
    if (it != m.end()) {
      _primChildrenIndices[i] = int64_t(it->second);

      table.insert(it->second);
    } else {
      // Prim name not found.
      _primChildrenIndices[i] = -1;
      valid = false;
    }
  }

  if (table.size() != _primChildrenIndices.size()) {
    // duplicated index exists.
    valid = false;
  }

  _primChildrenIndicesIsValid = valid;
  if (indices_is_valid) {
    (*indices_is_valid) = _primChildrenIndicesIsValid;
  }

  return _primChildrenIndices;
}